

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_google::protobuf::FieldMask>_>
::MapSorterFlat(MapSorterFlat<google::protobuf::Map<int,_google::protobuf::FieldMask>_> *this,
               Map<int,_google::protobuf::FieldMask> *m)

{
  pair<int,_const_void_*> *ppVar1;
  pair<int,_const_void_*> *ppVar2;
  ulong uVar3;
  const_iterator __begin0;
  UntypedMapIterator local_40;
  
  uVar3 = (ulong)(m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_elements_;
  this->size_ = uVar3;
  if (uVar3 == 0) {
    (this->items_)._M_t.
    super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl =
         (pair<int,_const_void_*> *)0x0;
  }
  else {
    ppVar1 = (pair<int,_const_void_*> *)operator_new__(uVar3 * 0x10);
    ppVar2 = ppVar1;
    do {
      ppVar2->first = 0;
      ppVar2->second = (void *)0x0;
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1 + uVar3);
    (this->items_)._M_t.
    super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl = ppVar1;
    UntypedMapBase::begin(&local_40,(UntypedMapBase *)m);
    while (local_40.node_ != (NodeBase *)0x0) {
      ppVar1->first = *(int *)&local_40.node_[1].next;
      ppVar1->second = local_40.node_ + 1;
      UntypedMapIterator::PlusPlus(&local_40);
      ppVar1 = ppVar1 + 1;
    }
    ppVar2 = (this->items_)._M_t.
             super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
             .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl;
    std::
    __sort<std::pair<int,void_const*>*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterLessThan<int>>>
              (ppVar2,ppVar2 + this->size_);
  }
  return;
}

Assistant:

inline void AddToRepeatedPtrField(google::protobuf::RepeatedPtrField<std::string>& dest,
                                  std::string&& value,
                                  BytesTag tag = BytesTag{}) {
  dest.Add(std::move(value));
}